

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O0

Task * __thiscall tf::Task::precede<tf::Task&,tf::Task&>(Task *this,Task *tasks,Task *tasks_1)

{
  Node *in_RDI;
  Node *unaff_retaddr;
  Node *v;
  
  v = in_RDI;
  Node::_precede(unaff_retaddr,in_RDI);
  Node::_precede(unaff_retaddr,v);
  return (Task *)in_RDI;
}

Assistant:

Task& Task::precede(Ts&&... tasks) {
  (_node->_precede(tasks._node), ...);
  //_precede(std::forward<Ts>(tasks)...);
  return *this;
}